

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR1.cpp
# Opt level: O0

void __thiscall Item::add(Item *this,string *prod)

{
  bool bVar1;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar2;
  __normal_iterator<Prod_*,_std::vector<Prod,_std::allocator<Prod>_>_> local_118;
  Prod *local_110;
  __normal_iterator<Prod_*,_std::vector<Prod,_std::allocator<Prod>_>_> local_108;
  __normal_iterator<Prod_*,_std::vector<Prod,_std::allocator<Prod>_>_> local_100;
  iterator it;
  allocator local_e1;
  string local_e0 [48];
  undefined1 local_b0 [8];
  Prod p;
  string *prod_local;
  Item *this_local;
  
  p.attrs._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)prod;
  Prod::Prod((Prod *)local_b0,prod);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_b0,"S\'");
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,"#",&local_e1);
    pVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&p.right.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_e0);
    it._M_current = (Prod *)pVar2.first._M_node;
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  }
  local_108._M_current = (Prod *)std::vector<Prod,_std::allocator<Prod>_>::begin(&this->prods);
  local_110 = (Prod *)std::vector<Prod,_std::allocator<Prod>_>::end(&this->prods);
  local_100 = std::
              find<__gnu_cxx::__normal_iterator<Prod*,std::vector<Prod,std::allocator<Prod>>>,Prod>
                        (local_108,
                         (__normal_iterator<Prod_*,_std::vector<Prod,_std::allocator<Prod>_>_>)
                         local_110,(Prod *)local_b0);
  local_118._M_current = (Prod *)std::vector<Prod,_std::allocator<Prod>_>::end(&this->prods);
  bVar1 = __gnu_cxx::operator==(&local_100,&local_118);
  if (bVar1) {
    std::vector<Prod,_std::allocator<Prod>_>::push_back(&this->prods,(value_type *)local_b0);
  }
  Prod::~Prod((Prod *)local_b0);
  return;
}

Assistant:

void Item::add(string &prod) {
    Prod p = Prod(prod);
    if (p.noTerminal == "S'") {
        p.additionalVt.insert("#");
    }
    vector<Prod>::iterator it = find(prods.begin(), prods.end(), p);
    //如果vector中保存的是自定义类型（结构体/类），则需要为该类型重载==操作符。再用find
    if (it == prods.end()) {
        prods.push_back(p);
    }
}